

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *this_00;
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  string sStack_2b8;
  string name;
  TestCase local_278;
  ostringstream oss;
  
  std::__cxx11::string::string((string *)&name,(string *)testCase);
  bVar1 = std::operator==(&name,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Anonymous test case ");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_278,testCase,&sStack_2b8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_278);
    TestCase::~TestCase(&local_278);
    std::__cxx11::string::~string((string *)&sStack_2b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  else {
    this_00 = &this->m_functions;
    iVar3 = std::
            _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::find(&this_00->_M_t,testCase);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar3 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&this_00->_M_t,testCase);
      poVar2 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      poVar2 = std::operator<<(poVar2,(string *)&name);
      poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
      poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&oss,(SourceLineInfo *)&iVar3._M_node[6]._M_left);
      poVar2 = operator<<(poVar2,(SourceLineInfo *)&oss);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\tRedefined at ");
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&local_278,&(testCase->super_TestCaseInfo).lineInfo);
      poVar2 = operator<<(poVar2,(SourceLineInfo *)&local_278);
      std::endl<char,std::char_traits<char>>(poVar2);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&local_278);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&oss);
      exit(1);
    }
    std::
    _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
    ::_M_insert_unique<Catch::TestCase_const&>
              ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                *)this_00,testCase);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functionsInOrder,testCase);
    if ((testCase->super_TestCaseInfo).isHidden == false) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (&this->m_nonHiddenFunctions,testCase);
    }
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getTestCaseInfo().lineInfo ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testCase.getTestCaseInfo().lineInfo ) << std::endl;
                exit(1);
            }
        }